

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O2

int omac_acpkm_imit_final(EVP_MD_CTX *ctx,uchar *md)

{
  CMAC_ACPKM_CTX *ctx_00;
  uint inl;
  int iVar1;
  undefined8 *puVar2;
  EVP_CIPHER *pEVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uchar *ptr;
  ulong len;
  uchar mac [16];
  undefined8 local_60;
  byte local_58 [40];
  
  puVar2 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  if (*(int *)(puVar2 + 3) == 0) {
    ERR_GOST_error(0x91,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                   ,0x160);
    uVar7 = 0;
  }
  else {
    ctx_00 = (CMAC_ACPKM_CTX *)*puVar2;
    uVar7 = 0;
    if (ctx_00->nlast_block != -1) {
      inl = EVP_CIPHER_CTX_get_block_size(ctx_00->cctx);
      len = (ulong)inl;
      if ((inl == 8) || (inl == 0x10)) {
        local_60 = (long)ctx_00->nlast_block;
        iVar1 = CMAC_ACPKM_Mesh(ctx_00);
        if (iVar1 != 0) {
          pEVar3 = EVP_CIPHER_CTX_cipher((EVP_CIPHER_CTX *)ctx_00->actx);
          iVar1 = EVP_CIPHER_get_key_length(pEVar3);
          lVar5 = (long)iVar1;
          ptr = ctx_00->km + lVar5;
          for (uVar6 = 0; len != uVar6; uVar6 = uVar6 + 1) {
            bVar4 = ctx_00->km[uVar6 + lVar5] * '\x02';
            local_58[uVar6] = bVar4;
            if ((uVar6 < inl - 1) && ((char)ctx_00->km[uVar6 + lVar5 + 1] < '\0')) {
              local_58[uVar6] = bVar4 | 1;
            }
          }
          if ((char)*ptr < '\0') {
            bVar4 = 0x1b;
            if (inl == 0x10) {
              bVar4 = 0x87;
            }
            local_58[(long)(int)inl + -1] = local_58[(long)(int)inl + -1] ^ bVar4;
          }
          if (inl == (uint)local_60) {
            for (uVar6 = 0; len != uVar6; uVar6 = uVar6 + 1) {
              mac[uVar6] = ptr[uVar6] ^ ctx_00->last_block[uVar6];
            }
          }
          else {
            ctx_00->last_block[local_60] = 0x80;
            iVar1 = inl - (uint)local_60;
            if (1 < iVar1) {
              memset(ctx_00->last_block + local_60 + 1,0,(ulong)(iVar1 - 1));
            }
            for (uVar6 = 0; len != uVar6; uVar6 = uVar6 + 1) {
              mac[uVar6] = local_58[uVar6] ^ ctx_00->last_block[uVar6];
            }
          }
          OPENSSL_cleanse(ptr,len);
          OPENSSL_cleanse(local_58,len);
          OPENSSL_cleanse(ctx_00->km,0x30);
          iVar1 = EVP_Cipher((EVP_CIPHER_CTX *)ctx_00->cctx,mac,mac,inl);
          if (iVar1 == 0) {
            OPENSSL_cleanse(mac,len);
          }
          uVar7 = (uint)(iVar1 != 0);
        }
      }
      else {
        ERR_GOST_error(0x91,0x74,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                       ,0x106);
      }
    }
    memcpy(md,mac,puVar2[1]);
  }
  return uVar7;
}

Assistant:

int omac_acpkm_imit_final(EVP_MD_CTX *ctx, unsigned char *md)
{
    OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
    unsigned char mac[MAX_GOST_OMAC_ACPKM_SIZE];
    size_t mac_size = sizeof(mac);
    int ret;

    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_ACPKM_IMIT_FINAL, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    ret = CMAC_ACPKM_Final(c->cmac_ctx, mac, &mac_size);

    memcpy(md, mac, c->dgst_size);
    return ret;
}